

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O1

int I422ToARGBMatrix(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
                    int src_stride_v,uint8_t *dst_argb,int dst_stride_argb,
                    YuvConstants *yuvconstants,int width,int height)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar6._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar6._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar6._12_4_ = -(uint)(dst_argb == (uint8_t *)0x0);
  iVar3 = movmskps((int)src_u,auVar6);
  iVar2 = -1;
  if ((height != 0 && 0 < width) && iVar3 == 0) {
    iVar3 = height;
    if (height < 0) {
      iVar3 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    if (width * 4 == dst_stride_argb &&
        (src_stride_v * 2 == width && (src_stride_u * 2 == width && src_stride_y == width))) {
      width = iVar3 * width;
      src_stride_y = 0;
      src_stride_u = 0;
      src_stride_v = 0;
      dst_stride_argb = 0;
      iVar3 = 1;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar4 = I422ToARGBRow_SSSE3;
    }
    else {
      pcVar4 = I422ToARGBRow_Any_SSSE3;
    }
    if ((uVar1 & 0x40) == 0) {
      pcVar4 = I422ToARGBRow_C;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar5 = I422ToARGBRow_AVX2;
    }
    else {
      pcVar5 = I422ToARGBRow_Any_AVX2;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      pcVar5 = pcVar4;
    }
    iVar2 = 0;
    if (0 < iVar3) {
      do {
        (*pcVar5)(src_y,src_u,src_v,dst_argb,yuvconstants,width);
        dst_argb = dst_argb + dst_stride_argb;
        src_y = src_y + src_stride_y;
        src_u = src_u + src_stride_u;
        src_v = src_v + src_stride_v;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

LIBYUV_API
int I422ToARGBMatrix(const uint8_t* src_y,
                     int src_stride_y,
                     const uint8_t* src_u,
                     int src_stride_u,
                     const uint8_t* src_v,
                     int src_stride_v,
                     uint8_t* dst_argb,
                     int dst_stride_argb,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*I422ToARGBRow)(const uint8_t* y_buf, const uint8_t* u_buf,
                        const uint8_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I422ToARGBRow_C;
  if (!src_y || !src_u || !src_v || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_y == width && src_stride_u * 2 == width &&
      src_stride_v * 2 == width && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_y = src_stride_u = src_stride_v = dst_stride_argb = 0;
  }
#if defined(HAS_I422TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I422ToARGBRow = I422ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I422ToARGBRow = I422ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I422ToARGBRow = I422ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I422ToARGBRow = I422ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I422ToARGBRow = I422ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I422ToARGBRow = I422ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I422ToARGBRow = I422ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    I422ToARGBRow(src_y, src_u, src_v, dst_argb, yuvconstants, width);
    dst_argb += dst_stride_argb;
    src_y += src_stride_y;
    src_u += src_stride_u;
    src_v += src_stride_v;
  }
  return 0;
}